

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O0

SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> * __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
SweepPendingObjects<(Memory::SweepMode)1>
          (SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,Recycler *recycler,
          SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list)

{
  anon_class_24_3_33b0e536 fn;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *local_28;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *tail;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list_local;
  Recycler *recycler_local;
  SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  local_28 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  fn.recycler = recycler;
  fn.this = this;
  fn.tail = &local_28;
  tail = list;
  list_local = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)recycler;
  recycler_local = (Recycler *)this;
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>::SweepPendingObjects<(Memory::SweepMode)1>(Memory::Recycler*,Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (list,fn);
  return local_28;
}

Assistant:

TBlockType *
SmallNormalHeapBucketBase<TBlockType>::SweepPendingObjects(Recycler * recycler, TBlockType * list)
{
    TBlockType * tail = nullptr;
    HeapBlockList::ForEachEditing(list, [this, recycler, &tail](TBlockType * heapBlock)
    {
        // Note, page heap blocks are never swept concurrently
#ifdef RECYCLER_TRACE
        recycler->PrintBlockStatus(this, heapBlock, _u("[**18**] calling SweepObjects."));
#endif
        heapBlock->template SweepObjects<mode>(recycler);
        tail = heapBlock;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
        if (this->AllocationsStartedDuringConcurrentSweep())
        {
            Assert(!this->IsAnyFinalizableBucket());
            DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
            // If we exhausted the free list during this sweep, we will need to send this block to the FullBlockList.
            if (heapBlock->HasFreeObject())
            {
                Assert(!heapBlock->isPendingConcurrentSweepPrep);
                bool blockAddedToSList = HeapBucketT<TBlockType>::PushHeapBlockToSList(this->allocableHeapBlockListHead, heapBlock);

                // If we encountered OOM while pushing the heapBlock to the SLIST we must add it to the heapBlockList so we don't lose track of it.
                if (!blockAddedToSList)
                {
                    //TODO: akatti: We should handle this gracefully and try to recover from this state.
                    AssertOrFailFastMsg(false, "OOM while adding a heap block to the SLIST during concurrent sweep.");
                }
#ifdef RECYCLER_TRACE
                else
                {
                    recycler->PrintBlockStatus(this, heapBlock, _u("[**24**] finished SweepPendingObjects, heapblock added to SLIST allocableHeapBlockListHead."));
                }
#endif
            }
            else
            {
                DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
                heapBlock->SetNextBlock(this->fullBlockList);
                this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**25**] finished SweepPendingObjects, heapblock added to fullBlockList."));
#endif
            }
        }
#endif
    });
    return tail;
}